

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_ellswift_create(secp256k1_context *ctx,uchar *ell64,uchar *seckey32,uchar *auxrnd32)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char cVar6;
  int iVar7;
  long lVar8;
  uchar *p_1;
  uint uVar9;
  undefined1 auVar10 [16];
  secp256k1_scalar seckey_scalar;
  unsigned_long _zzq_result;
  int vflag;
  secp256k1_ge p;
  secp256k1_fe t;
  secp256k1_scalar local_174 [17];
  secp256k1_ge local_130;
  secp256k1_sha256 local_c8;
  secp256k1_fe local_60;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ellswift_create_cold_6();
  }
  else if (ell64 != (uchar *)0x0) {
    *(undefined1 (*) [16])(ell64 + 0x30) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(ell64 + 0x20) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(ell64 + 0x10) = (undefined1  [16])0x0;
    ell64[0] = '\0';
    ell64[1] = '\0';
    ell64[2] = '\0';
    ell64[3] = '\0';
    ell64[4] = '\0';
    ell64[5] = '\0';
    ell64[6] = '\0';
    ell64[7] = '\0';
    ell64[8] = '\0';
    ell64[9] = '\0';
    ell64[10] = '\0';
    ell64[0xb] = '\0';
    ell64[0xc] = '\0';
    ell64[0xd] = '\0';
    ell64[0xe] = '\0';
    ell64[0xf] = '\0';
    if ((ctx->ecmult_gen_ctx).built == 0) {
      secp256k1_ellswift_create_cold_4();
      return 0;
    }
    if (seckey32 == (uchar *)0x0) {
      secp256k1_ellswift_create_cold_3();
      return 0;
    }
    iVar7 = secp256k1_ec_pubkey_create_helper(&ctx->ecmult_gen_ctx,local_174,&local_130,seckey32);
    if (ctx->declassify != 0) {
      secp256k1_ellswift_create_cold_1();
    }
    secp256k1_fe_normalize_var(&local_130.x);
    secp256k1_fe_normalize_var(&local_130.y);
    local_c8.s[0] = 0xd29e1bf5;
    local_c8.s[1] = 0xf7025f42;
    local_c8.s[2] = 0x9b024773;
    local_c8.s[3] = 0x94cb7d5;
    local_c8.s[4] = 0xe59ed789;
    local_c8.s[5] = 0x3bc9786;
    local_c8.s[6] = 0x68335b35;
    local_c8.s[7] = 0x4e363b53;
    local_c8.bytes = 0x40;
    secp256k1_sha256_write(&local_c8,seckey32,0x20);
    secp256k1_sha256_write(&local_c8,"",0x20);
    if (ctx->declassify != 0) {
      secp256k1_ellswift_create_cold_2();
    }
    if (auxrnd32 != (uchar *)0x0) {
      secp256k1_sha256_write(&local_c8,auxrnd32,0x20);
    }
    secp256k1_ellswift_elligatorswift_var(ell64,&local_60,&local_130,&local_c8);
    secp256k1_fe_get_b32(ell64 + 0x20,&local_60);
    cVar6 = ((byte)iVar7 ^ 1) - 1;
    auVar10 = ZEXT216(CONCAT11(cVar6,cVar6));
    auVar10 = pshuflw(auVar10,auVar10,0);
    uVar9 = auVar10._0_4_;
    lVar8 = 0;
    do {
      puVar1 = (uint *)(ell64 + lVar8);
      uVar3 = puVar1[1];
      uVar4 = puVar1[2];
      uVar5 = puVar1[3];
      puVar2 = (uint *)(ell64 + lVar8);
      *puVar2 = *puVar1 & uVar9;
      puVar2[1] = uVar3 & uVar9;
      puVar2[2] = uVar4 & uVar9;
      puVar2[3] = uVar5 & uVar9;
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x40);
    return iVar7;
  }
  secp256k1_ellswift_create_cold_5();
  return 0;
}

Assistant:

int secp256k1_ellswift_create(const secp256k1_context *ctx, unsigned char *ell64, const unsigned char *seckey32, const unsigned char *auxrnd32) {
    secp256k1_ge p;
    secp256k1_fe t;
    secp256k1_sha256 hash;
    secp256k1_scalar seckey_scalar;
    int ret;
    static const unsigned char zero32[32] = {0};

    /* Sanity check inputs. */
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(ell64 != NULL);
    memset(ell64, 0, 64);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(seckey32 != NULL);

    /* Compute (affine) public key */
    ret = secp256k1_ec_pubkey_create_helper(&ctx->ecmult_gen_ctx, &seckey_scalar, &p, seckey32);
    secp256k1_declassify(ctx, &p, sizeof(p)); /* not constant time in produced pubkey */
    secp256k1_fe_normalize_var(&p.x);
    secp256k1_fe_normalize_var(&p.y);

    /* Set up hasher state. The used RNG is H(privkey || "\x00"*32 [|| auxrnd32] || cnt++),
     * using BIP340 tagged hash with tag "secp256k1_ellswift_create". */
    secp256k1_ellswift_sha256_init_create(&hash);
    secp256k1_sha256_write(&hash, seckey32, 32);
    secp256k1_sha256_write(&hash, zero32, sizeof(zero32));
    secp256k1_declassify(ctx, &hash, sizeof(hash)); /* private key is hashed now */
    if (auxrnd32) secp256k1_sha256_write(&hash, auxrnd32, 32);

    /* Compute ElligatorSwift encoding and construct output. */
    secp256k1_ellswift_elligatorswift_var(ell64, &t, &p, &hash); /* puts u in ell64[0..32] */
    secp256k1_fe_get_b32(ell64 + 32, &t); /* puts t in ell64[32..64] */

    secp256k1_memczero(ell64, 64, !ret);
    secp256k1_scalar_clear(&seckey_scalar);

    return ret;
}